

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O3

void __thiscall ON_Leader::SetPoints3d(ON_Leader *this,int count,ON_3dPoint *points)

{
  ON_2dPoint *__s;
  bool bVar1;
  ulong uVar2;
  ON_2dPoint uv;
  ON_2dPoint local_40;
  
  uVar2 = (ulong)(uint)count;
  __s = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
  if (__s != (ON_2dPoint *)0x0) {
    memset(__s,0,(long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity << 4);
  }
  (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  if (0 < count) {
    do {
      bVar1 = ON_Plane::ClosestPointTo
                        (&(this->super_ON_Annotation).m_plane,*points,&local_40.x,&local_40.y);
      if (bVar1) {
        ON_SimpleArray<ON_2dPoint>::Append
                  (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&local_40);
      }
      points = points + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (this->m_curve != (ON_NurbsCurve *)0x0) {
    (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    this->m_curve = (ON_NurbsCurve *)0x0;
  }
  ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
  return;
}

Assistant:

void ON_Leader::SetPoints3d(int count, const ON_3dPoint* points)
{
  m_points.Empty();
  ON_2dPoint uv;
  for (int i = 0; i < count; i++)
  {
    if(m_plane.ClosestPointTo(points[i], &uv.x, &uv.y))
      m_points.Append(uv);
  }
  if (nullptr != m_curve)
  {
    delete m_curve;
    m_curve = nullptr;
  }
  InvalidateTextPoint();
}